

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O0

bool __thiscall FIX::FileStore::set(FileStore *this,SEQNUM msgSeqNum,string *msg)

{
  int iVar1;
  IOException *pIVar2;
  pointer ppVar3;
  void *__ptr;
  size_t __n;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>,_bool>
  pVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  pair<long,_unsigned_long> local_130;
  _Base_ptr local_120;
  undefined1 local_118;
  pair<long,_unsigned_long> local_110;
  pair<const_unsigned_long,_std::pair<long,_unsigned_long>_> local_100;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_> local_e8;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>,_bool>
  it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  unsigned_long local_b0;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long local_80;
  long offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_4d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *msg_local;
  SEQNUM msgSeqNum_local;
  FileStore *this_local;
  
  local_20 = msg;
  msg_local = (string *)msgSeqNum;
  msgSeqNum_local = (SEQNUM)this;
  iVar1 = fseek((FILE *)this->m_msgFile,0,2);
  if (iVar1 != 0) {
    local_4d = 1;
    pIVar2 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_40,"Cannot seek to end of ",&this->m_msgFileName);
    IOException::IOException(pIVar2,&local_40);
    local_4d = 0;
    __cxa_throw(pIVar2,&IOException::typeinfo,IOException::~IOException);
  }
  iVar1 = fseek((FILE *)this->m_headerFile,0,2);
  if (iVar1 != 0) {
    offset._7_1_ = 1;
    pIVar2 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_70,"Cannot seek to end of ",&this->m_headerFileName);
    IOException::IOException(pIVar2,&local_70);
    offset._7_1_ = 0;
    __cxa_throw(pIVar2,&IOException::typeinfo,IOException::~IOException);
  }
  local_80 = ftell((FILE *)this->m_msgFile);
  if (local_80 < 0) {
    size._7_1_ = 1;
    pIVar2 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_a0,"Unable to get file pointer position from ",&this->m_msgFileName);
    IOException::IOException(pIVar2,&local_a0);
    size._7_1_ = 0;
    __cxa_throw(pIVar2,&IOException::typeinfo,IOException::~IOException);
  }
  local_b0 = std::__cxx11::string::size();
  iVar1 = fprintf((FILE *)this->m_headerFile,"%lu,%ld,%zu ",msg_local,local_80,local_b0);
  if (iVar1 < 0) {
    it._15_1_ = 1;
    pIVar2 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_d0,"Unable to write to file ",&this->m_headerFileName);
    IOException::IOException(pIVar2,&local_d0);
    it._15_1_ = 0;
    __cxa_throw(pIVar2,&IOException::typeinfo,IOException::~IOException);
  }
  local_110 = std::make_pair<long&,unsigned_long&>(&local_80,&local_b0);
  std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>::
  pair<unsigned_long_&,_std::pair<long,_unsigned_long>,_true>
            (&local_100,(unsigned_long *)&msg_local,&local_110);
  pVar4 = std::
          map<unsigned_long,_std::pair<long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>_>
          ::insert(&this->m_offsets,&local_100);
  local_120 = (_Base_ptr)pVar4.first._M_node;
  local_118 = pVar4.second;
  local_e8._M_node = local_120;
  it.first._M_node._0_1_ = local_118;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_130 = std::make_pair<long&,unsigned_long&>(&local_80,&local_b0);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>::
             operator->(&local_e8);
    std::pair<long,_unsigned_long>::operator=(&ppVar3->second,&local_130);
  }
  __ptr = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  fwrite(__ptr,1,__n,(FILE *)this->m_msgFile);
  iVar1 = ferror((FILE *)this->m_msgFile);
  if (iVar1 != 0) {
    local_151 = 1;
    pIVar2 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_150,"Unable to write to file ",&this->m_msgFileName);
    IOException::IOException(pIVar2,&local_150);
    local_151 = 0;
    __cxa_throw(pIVar2,&IOException::typeinfo,IOException::~IOException);
  }
  iVar1 = fflush((FILE *)this->m_msgFile);
  if (iVar1 == -1) {
    local_179 = 1;
    pIVar2 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_178,"Unable to flush file ",&this->m_msgFileName);
    IOException::IOException(pIVar2,&local_178);
    local_179 = 0;
    __cxa_throw(pIVar2,&IOException::typeinfo,IOException::~IOException);
  }
  iVar1 = fflush((FILE *)this->m_headerFile);
  if (iVar1 == -1) {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_1a0,"Unable to flush file ",&this->m_headerFileName);
    IOException::IOException(pIVar2,&local_1a0);
    __cxa_throw(pIVar2,&IOException::typeinfo,IOException::~IOException);
  }
  return true;
}

Assistant:

EXCEPT(IOException) {
  if (fseek(m_msgFile, 0, SEEK_END)) {
    throw IOException("Cannot seek to end of " + m_msgFileName);
  }
  if (fseek(m_headerFile, 0, SEEK_END)) {
    throw IOException("Cannot seek to end of " + m_headerFileName);
  }

  long offset = ftell(m_msgFile);
  if (offset < 0) {
    throw IOException("Unable to get file pointer position from " + m_msgFileName);
  }
  std::size_t size = msg.size();

  if (fprintf(m_headerFile, "%" SCNu64 ",%ld,%zu ", msgSeqNum, offset, size) < 0) {
    throw IOException("Unable to write to file " + m_headerFileName);
  }
  std::pair<NumToOffset::iterator, bool> it
      = m_offsets.insert(NumToOffset::value_type(msgSeqNum, std::make_pair(offset, size)));
  if (it.second == false) {
    it.first->second = std::make_pair(offset, size);
  }
  fwrite(msg.c_str(), sizeof(char), msg.size(), m_msgFile);
  if (ferror(m_msgFile)) {
    throw IOException("Unable to write to file " + m_msgFileName);
  }
  if (fflush(m_msgFile) == EOF) {
    throw IOException("Unable to flush file " + m_msgFileName);
  }
  if (fflush(m_headerFile) == EOF) {
    throw IOException("Unable to flush file " + m_headerFileName);
  }
  return true;
}